

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O1

void line_stop(t_line_conflict *x)

{
  t_float tVar1;
  double dVar2;
  double dVar3;
  
  if (0x2f < pd_compatibilitylevel) {
    dVar2 = clock_getsystime();
    if (x->x_targettime <= dVar2) {
      tVar1 = x->x_targetval;
    }
    else {
      dVar2 = x->x_1overtimediff;
      dVar3 = clock_getsystime();
      tVar1 = (t_float)((double)x->x_setval +
                       (double)(x->x_targetval - x->x_setval) * (dVar3 - x->x_prevtime) * dVar2);
    }
    x->x_setval = tVar1;
  }
  x->x_targetval = x->x_setval;
  clock_unset(x->x_clock);
  return;
}

Assistant:

static void line_stop(t_line *x)
{
    if (pd_compatibilitylevel >= 48)
    {
        if (clock_getsystime() >= x->x_targettime)
            x->x_setval = x->x_targetval;
        else x->x_setval += x->x_1overtimediff *
            (clock_getsystime() - x->x_prevtime) *
                (x->x_targetval - x->x_setval);
    }
    x->x_targetval = x->x_setval;
    clock_unset(x->x_clock);
}